

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

CodeGeneratorResponse_File * __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::New
          (CodeGeneratorResponse_File *this,Arena *arena)

{
  CodeGeneratorResponse_File *this_00;
  
  this_00 = (CodeGeneratorResponse_File *)operator_new(0x30);
  CodeGeneratorResponse_File(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::compiler::CodeGeneratorResponse_File>(arena,this_00);
  }
  return this_00;
}

Assistant:

CodeGeneratorResponse_File* CodeGeneratorResponse_File::New(::google::protobuf::Arena* arena) const {
  CodeGeneratorResponse_File* n = new CodeGeneratorResponse_File;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}